

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

void __thiscall
MempoolAcceptResult::MempoolAcceptResult(MempoolAcceptResult *this,int64_t vsize,CAmount fees)

{
  long lVar1;
  optional<long> *in_RDX;
  TxValidationState *in_RDI;
  long in_FS_OFFSET;
  TxValidationState *__t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_ValidationState<TxValidationResult>).m_mode = M_ERROR;
  __t = in_RDI;
  TxValidationState::TxValidationState(in_RDI);
  std::__cxx11::
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>::
  list((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        *)in_RDI);
  std::optional<long>::optional<long_&,_true>(in_RDX,(long *)__t);
  std::optional<long>::optional<long_&,_true>(in_RDX,(long *)__t);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)in_RDI);
  std::
  optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  ::optional((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              *)in_RDI);
  std::optional<uint256>::optional((optional<uint256> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MempoolAcceptResult(int64_t vsize, CAmount fees)
        : m_result_type(ResultType::MEMPOOL_ENTRY), m_vsize{vsize}, m_base_fees(fees) {}